

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>::
print_to_file(Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
              *this,char *filename)

{
  ostream *poVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type local_238;
  size_t j;
  size_t i;
  ostream local_218 [8];
  ofstream out;
  char *filename_local;
  Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
  *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,filename,0x10);
  poVar1 = (ostream *)std::ostream::operator<<(local_218,this->min_);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->max_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  j = 0;
  while( true ) {
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->heat_map);
    if (j == sVar2) break;
    local_238 = 0;
    while( true ) {
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->heat_map,j);
      sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
      if (local_238 == sVar2) break;
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->heat_map,j);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,local_238);
      poVar1 = (ostream *)std::ostream::operator<<(local_218,*pvVar4);
      std::operator<<(poVar1," ");
      local_238 = local_238 + 1;
    }
    std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
    j = j + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::print_to_file(const char* filename) const {
  std::ofstream out;
  out.open(filename);

  // First we store this->min_ and this->max_ values:
  out << this->min_ << " " << this->max_ << std::endl;
  for (size_t i = 0; i != this->heat_map.size(); ++i) {
    for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
      out << this->heat_map[i][j] << " ";
    }
    out << std::endl;
  }
  out.close();
}